

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>>>::Visitor,0ul,1ul,2ul,3ul>
               (FieldRef<Fixpp::TagT<865U,_Fixpp::Type::Int>_> *message,uint tag,Visitor *visitor)

{
  unsigned_long *puVar1;
  uint local_2c [2];
  int index;
  
  local_2c[0] = 0xffffffff;
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<865u,Fixpp::Type::Int>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>>>::Visitor>
            (tag,message,visitor,(int *)local_2c);
  doVisitSingleField<1ul,Fixpp::FieldRef<Fixpp::TagT<866u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>>>::Visitor>
            (tag,(FieldRef<Fixpp::TagT<866U,_Fixpp::Type::String>_> *)(message + 1),visitor,
             (int *)local_2c);
  doVisitSingleField<2ul,Fixpp::FieldRef<Fixpp::TagT<867u,Fixpp::Type::Float>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>>>::Visitor>
            (tag,(FieldRef<Fixpp::TagT<867U,_Fixpp::Type::Float>_> *)(message + 2),visitor,
             (int *)local_2c);
  doVisitSingleField<3ul,Fixpp::FieldRef<Fixpp::TagT<868u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>>>::Visitor>
            (tag,(FieldRef<Fixpp::TagT<868U,_Fixpp::Type::String>_> *)(message + 3),visitor,
             (int *)local_2c);
  if ((long)(int)local_2c[0] != -1) {
    if (3 < local_2c[0]) {
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                 (long)(int)local_2c[0],4);
    }
    puVar1 = &message[4].m_view.second;
    *puVar1 = *puVar1 | 1L << ((byte)local_2c[0] & 0x3f);
  }
  return local_2c[0] != 0xffffffff;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }